

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.c
# Opt level: O3

gf gf_inv(gf in)

{
  gf gVar1;
  gf gVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined6 in_register_0000003a;
  
  uVar3 = (uint)CONCAT62(in_register_0000003a,in);
  uVar3 = (uVar3 << 8 | uVar3) & 0xff00ff;
  uVar3 = (uVar3 << 4 | uVar3) & 0xf0f0f0f;
  uVar3 = (uVar3 * 4 | uVar3) & 0x33333333;
  uVar3 = uVar3 * 2 | uVar3;
  uVar4 = uVar3 & 0x554000;
  uVar5 = uVar4 >> 9 | uVar3 & 0x55555555;
  uVar3 = uVar5 & 0x3000;
  gVar1 = gf_mul((ushort)uVar5 & 0xff5 ^
                 ((ushort)(uVar3 >> 0xc) | (ushort)(uVar3 >> 9) ^ (ushort)(uVar4 >> 0xc)),in);
  uVar3 = ((uint)gVar1 << 8 | (uint)gVar1) & 0xf00ff;
  uVar3 = (uVar3 << 4 | uVar3) & 0xf0f0f;
  uVar3 = (uVar3 * 4 | uVar3) & 0x333333;
  uVar3 = uVar3 * 2 | uVar3;
  uVar4 = uVar3 & 0x554000;
  uVar5 = uVar4 >> 9 | uVar3 & 0x555555;
  uVar3 = uVar5 & 0x3000;
  uVar3 = uVar5 & 0xff5 ^ (uVar3 >> 0xc | uVar3 >> 9 ^ uVar4 >> 0xc);
  uVar3 = (uVar3 << 8 | uVar3) & 0xff00ff;
  uVar3 = (uVar3 << 4 | uVar3) & 0xf0f0f0f;
  uVar3 = (uVar3 * 4 | uVar3) & 0x33333333;
  uVar3 = uVar3 * 2 | uVar3;
  uVar4 = uVar3 & 0x554000;
  uVar5 = uVar4 >> 9 | uVar3 & 0x55555555;
  uVar3 = uVar5 & 0x3000;
  gVar2 = gf_mul((ushort)uVar5 & 0xff5 ^
                 ((ushort)(uVar3 >> 0xc) | (ushort)(uVar3 >> 9) ^ (ushort)(uVar4 >> 0xc)),gVar1);
  uVar3 = ((uint)gVar2 << 8 | (uint)gVar2) & 0xf00ff;
  uVar3 = (uVar3 << 4 | uVar3) & 0xf0f0f;
  uVar3 = (uVar3 * 4 | uVar3) & 0x333333;
  uVar3 = uVar3 * 2 | uVar3;
  uVar4 = uVar3 & 0x554000;
  uVar5 = uVar4 >> 9 | uVar3 & 0x555555;
  uVar3 = uVar5 & 0x3000;
  uVar3 = uVar5 & 0xff5 ^ (uVar3 >> 0xc | uVar3 >> 9 ^ uVar4 >> 0xc);
  uVar3 = (uVar3 << 8 | uVar3) & 0xff00ff;
  uVar3 = (uVar3 << 4 | uVar3) & 0xf0f0f0f;
  uVar3 = (uVar3 * 4 | uVar3) & 0x33333333;
  uVar3 = uVar3 * 2 | uVar3;
  uVar4 = uVar3 & 0x554000;
  uVar5 = uVar4 >> 9 | uVar3 & 0x55555555;
  uVar3 = uVar5 & 0x3000;
  uVar3 = uVar5 & 0xff5 ^ (uVar3 >> 0xc | uVar3 >> 9 ^ uVar4 >> 0xc);
  uVar3 = (uVar3 << 8 | uVar3) & 0xff00ff;
  uVar3 = (uVar3 << 4 | uVar3) & 0xf0f0f0f;
  uVar3 = (uVar3 * 4 | uVar3) & 0x33333333;
  uVar3 = uVar3 * 2 | uVar3;
  uVar4 = uVar3 & 0x554000;
  uVar5 = uVar4 >> 9 | uVar3 & 0x55555555;
  uVar3 = uVar5 & 0x3000;
  uVar3 = uVar5 & 0xff5 ^ (uVar3 >> 0xc | uVar3 >> 9 ^ uVar4 >> 0xc);
  uVar3 = (uVar3 << 8 | uVar3) & 0xff00ff;
  uVar3 = (uVar3 << 4 | uVar3) & 0xf0f0f0f;
  uVar3 = (uVar3 * 4 | uVar3) & 0x33333333;
  uVar3 = uVar3 * 2 | uVar3;
  uVar4 = uVar3 & 0x554000;
  uVar5 = uVar4 >> 9 | uVar3 & 0x55555555;
  uVar3 = uVar5 & 0x3000;
  gVar2 = gf_mul((ushort)uVar5 & 0xff5 ^
                 ((ushort)(uVar3 >> 0xc) | (ushort)(uVar3 >> 9) ^ (ushort)(uVar4 >> 0xc)),gVar2);
  uVar3 = ((uint)gVar2 << 8 | (uint)gVar2) & 0xf00ff;
  uVar3 = (uVar3 << 4 | uVar3) & 0xf0f0f;
  uVar3 = (uVar3 * 4 | uVar3) & 0x333333;
  uVar3 = uVar3 * 2 | uVar3;
  uVar4 = uVar3 & 0x554000;
  uVar5 = uVar4 >> 9 | uVar3 & 0x555555;
  uVar3 = uVar5 & 0x3000;
  uVar3 = uVar5 & 0xff5 ^ (uVar3 >> 0xc | uVar3 >> 9 ^ uVar4 >> 0xc);
  uVar3 = (uVar3 << 8 | uVar3) & 0xff00ff;
  uVar3 = (uVar3 << 4 | uVar3) & 0xf0f0f0f;
  uVar3 = (uVar3 * 4 | uVar3) & 0x33333333;
  uVar3 = uVar3 * 2 | uVar3;
  uVar4 = uVar3 & 0x554000;
  uVar5 = uVar4 >> 9 | uVar3 & 0x55555555;
  uVar3 = uVar5 & 0x3000;
  gVar1 = gf_mul((ushort)uVar5 & 0xff5 ^
                 ((ushort)(uVar3 >> 0xc) | (ushort)(uVar3 >> 9) ^ (ushort)(uVar4 >> 0xc)),gVar1);
  uVar3 = ((uint)gVar1 << 8 | (uint)gVar1) & 0xf00ff;
  uVar3 = (uVar3 << 4 | uVar3) & 0xf0f0f;
  uVar3 = (uVar3 * 4 | uVar3) & 0x333333;
  uVar3 = uVar3 * 2 | uVar3;
  uVar4 = uVar3 & 0x554000;
  uVar5 = uVar4 >> 9 | uVar3 & 0x555555;
  uVar3 = uVar5 & 0x3000;
  gVar1 = gf_mul((ushort)uVar5 & 0xff5 ^
                 ((ushort)(uVar3 >> 0xc) | (ushort)(uVar3 >> 9) ^ (ushort)(uVar4 >> 0xc)),in);
  uVar3 = ((uint)gVar1 << 8 | (uint)gVar1) & 0xf00ff;
  uVar3 = (uVar3 << 4 | uVar3) & 0xf0f0f;
  uVar3 = (uVar3 * 4 | uVar3) & 0x333333;
  uVar3 = uVar3 * 2 | uVar3;
  uVar4 = uVar3 & 0x554000;
  uVar3 = uVar4 >> 9 | uVar3 & 0x555555;
  uVar5 = uVar3 & 0x3000;
  return (ushort)uVar3 & 0xff5 ^
         ((ushort)(uVar5 >> 0xc) | (ushort)(uVar5 >> 9) ^ (ushort)(uVar4 >> 0xc));
}

Assistant:

static inline gf gf_sq(gf in)
{
	const uint32_t B[] = {0x55555555, 0x33333333, 0x0F0F0F0F, 0x00FF00FF};

	uint32_t x = in; 
	uint32_t t;

	x = (x | (x << 8)) & B[3];
	x = (x | (x << 4)) & B[2];
	x = (x | (x << 2)) & B[1];
	x = (x | (x << 1)) & B[0];

	t = x & 0x7FC000;
	x ^= t >> 9;
	x ^= t >> 12;

	t = x & 0x3000;
	x ^= t >> 9;
	x ^= t >> 12;

	return x & ((1 << GFBITS)-1);
}